

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_goaway_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  int rv;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if ((frame->hd).stream_id == 0) {
    if ((((frame->priority).pri_spec.stream_id < 1) ||
        (iVar1 = nghttp2_session_is_my_stream_id(session,(frame->priority).pri_spec.stream_id),
        iVar1 != 0)) && ((frame->priority).pri_spec.stream_id <= session->remote_last_stream_id)) {
      session->goaway_flags = session->goaway_flags | 8;
      session->remote_last_stream_id = (frame->priority).pri_spec.stream_id;
      session_local._4_4_ = session_call_on_frame_received(session,frame);
      iVar1 = nghttp2_is_fatal(session_local._4_4_);
      if (iVar1 == 0) {
        session_local._4_4_ =
             session_close_stream_on_goaway(session,(frame->priority).pri_spec.stream_id,0);
      }
    }
    else {
      session_local._4_4_ =
           session_handle_invalid_connection(session,frame,-0x1f9,"GOAWAY: invalid last_stream_id");
    }
  }
  else {
    session_local._4_4_ =
         session_handle_invalid_connection(session,frame,-0x1f9,"GOAWAY: stream_id != 0");
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_on_goaway_received(nghttp2_session *session,
                                       nghttp2_frame *frame) {
  int rv;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "GOAWAY: stream_id != 0");
  }
  /* Spec says Endpoints MUST NOT increase the value they send in the
     last stream identifier. */
  if ((frame->goaway.last_stream_id > 0 &&
       !nghttp2_session_is_my_stream_id(session,
                                        frame->goaway.last_stream_id)) ||
      session->remote_last_stream_id < frame->goaway.last_stream_id) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "GOAWAY: invalid last_stream_id");
  }

  session->goaway_flags |= NGHTTP2_GOAWAY_RECV;

  session->remote_last_stream_id = frame->goaway.last_stream_id;

  rv = session_call_on_frame_received(session, frame);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return session_close_stream_on_goaway(session, frame->goaway.last_stream_id,
                                        0);
}